

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

void GC::CheckPointer(char *ptr)

{
  uint newSize;
  void *ptr_00;
  ulong uVar1;
  char ***pppcVar2;
  char *local_8;
  
  ptr_00 = *(void **)ptr;
  if (((void *)0x10000 < ptr_00) && ((ptr_00 < unmanageableBase || (unmanageableTop < ptr_00)))) {
    local_8 = (char *)NULLC::GetBasePointer(ptr_00);
    if (local_8 != (char *)0x0) {
      uVar1 = *(ulong *)(local_8 + -8);
      if ((uVar1 & 2) != 0) {
        __assert_fail("!\"reached a freed pointer\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_Common.cpp"
                      ,0x2e5,"void GC::PrintMarker(markerType)");
      }
      if ((uVar1 & 1) == 0) {
        *(ulong *)(local_8 + -8) = uVar1 | 1;
        if (*(uint *)(NULLC::commonLinker + 0x20c) <= (uint)(uVar1 >> 8)) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x7f,
                        "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        if (*(int *)(*(long *)(NULLC::commonLinker + 0x200) + 0x10 +
                    (uVar1 >> 8 & 0xffffffff) * 0x50) != 0) {
          newSize = next->count;
          if (newSize == next->max) {
            FastVector<char_*,_false,_false>::grow_and_add(next,newSize,&local_8);
          }
          else {
            pppcVar2 = &next->data;
            next->count = newSize + 1;
            (*pppcVar2)[newSize] = local_8;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CheckPointer(char* ptr)
	{
		// We have pointer to stack that has a pointer inside, so 'ptr' is really a pointer to pointer
		char *target = ReadVmMemoryPointer(ptr);

		// Check for unmanageable ranges. Range of 0x00000000-0x00010000 is unmanageable by default due to upvalues with offsets inside closures.
		if(target > (char*)0x00010000 && (target < unmanageableBase || target > unmanageableTop))
		{
			// Get type that pointer points to
			GC_DEBUG_PRINT("\tGlobal pointer [ref] %p (at %p)\n", target, ptr);

			// Get pointer to the start of memory block. Some pointers may point to the middle of memory blocks
			unsigned int *basePtr = (unsigned int*)NULLC::GetBasePointer(target);

			// If there is no base, this pointer points to memory that is not GCs memory
			if(!basePtr)
				return;

			GC_DEBUG_PRINT("\tPointer base is %p\n", basePtr);

			// Marker is before the block
			markerType *marker = (markerType*)((char*)basePtr - sizeof(markerType));
			PrintMarker(*marker);

			// If block is unmarked
			if((*marker & OBJECT_VISIBLE))
				return;

			// Mark block as used
			*marker |= OBJECT_VISIBLE;

			GC_DEBUG_PRINT("\tMarked as used\n");

			unsigned typeId = unsigned(*marker >> 8);
			const ExternTypeInfo &type = NULLC::commonLinker->exTypes[typeId];

			// And if type is not simple, check memory to which pointer points to
			if(type.subCat != ExternTypeInfo::CAT_NONE)
			{
				GC_DEBUG_PRINT("\tPointer %p scheduled on next loop\n", target);

				next->push_back((char*)basePtr);
			}
		}
	}